

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

int next_cache_entry(archive_read *a,iso9660 *iso9660,file_info **pfile)

{
  heap_queue *heap;
  int *piVar1;
  anon_struct_16_2_ec647c9d_for_rede_files *paVar2;
  file_info ***pppfVar3;
  byte *pbVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  file_info *pfVar9;
  file_info *pfVar10;
  ulong uVar11;
  uint64_t uVar12;
  ulong uVar13;
  file_info **ppfVar14;
  long lVar15;
  undefined8 uVar16;
  file_info *pfVar17;
  uint64_t uVar18;
  byte *isodirrec;
  file_info *pfVar19;
  content *pcVar20;
  size_t sVar21;
  void *pvVar22;
  long *plVar23;
  long lVar24;
  ulong uVar25;
  file_info ***pppfVar26;
  uchar *p;
  char *fmt;
  byte *pbVar27;
  size_t min;
  anon_struct_16_2_ec647c9d_for_cache_files *paVar28;
  uint uVar29;
  anon_struct_16_2_ec647c9d_for_re_files *paVar30;
  file_info **ppfVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  ulong uVar36;
  void *pvVar37;
  int iVar38;
  bool bVar39;
  anon_struct_16_2_ec647c9d empty_files;
  file_info *local_80;
  file_info *local_68;
  file_info **ppfStack_60;
  anon_struct_16_2_ec647c9d_for_cache_files *local_58;
  anon_struct_16_2_ec647c9d_for_re_files *local_50;
  heap_queue *local_48;
  void *local_40;
  size_t local_38;
  
  do {
    paVar28 = &iso9660->cache_files;
    pfVar17 = (iso9660->cache_files).first;
    if (pfVar17 != (file_info *)0x0) {
      pfVar19 = pfVar17->next;
      paVar28->first = pfVar19;
      if (pfVar19 == (file_info *)0x0) {
        (iso9660->cache_files).last = &paVar28->first;
      }
      *pfile = pfVar17;
      uVar25 = 0;
      goto LAB_003fa744;
    }
    heap = &iso9660->pending_files;
    pfVar17 = heap_get_entry(heap);
    *pfile = pfVar17;
    if (pfVar17 != (file_info *)0x0) {
      paVar30 = &iso9660->re_files;
LAB_003fa780:
      uVar18 = pfVar17->cl_offset;
      if (uVar18 == 0) {
        if ((pfVar17->mode & 0xf000) != 0x4000) goto LAB_003fafbb;
        pvVar37 = a->format->data;
        local_58 = paVar28;
        local_50 = paVar30;
        if (*(long *)((long)pvVar37 + 0xe0) != 0) {
          __archive_read_consume(a,*(long *)((long)pvVar37 + 0xe0));
          *(undefined8 *)((long)pvVar37 + 0xe0) = 0;
        }
        uVar25 = *(ulong *)((long)pvVar37 + 0xa0);
        uVar11 = pfVar17->offset;
        if (uVar11 < uVar25) {
          archive_set_error(&a->archive,-1,"Ignoring out-of-order directory (%s) %jd > %jd",
                            (pfVar17->name).s);
LAB_003faf60:
          uVar25 = 0xffffffec;
          goto LAB_003fa744;
        }
        uVar18 = pfVar17->size;
        if (*(ulong *)((long)pvVar37 + 0xb0) < uVar18 + uVar11) {
          archive_set_error(&a->archive,-1,"Directory is beyond end-of-media: %s",(pfVar17->name).s)
          ;
          goto LAB_003faf60;
        }
        if (uVar11 < uVar25 || uVar11 - uVar25 == 0) {
LAB_003fa885:
          uVar25 = (*(ulong *)((long)pvVar37 + 0xa8) + uVar18) - 1;
          min = uVar25 - uVar25 % *(ulong *)((long)pvVar37 + 0xa8);
          isodirrec = (byte *)__archive_read_ahead(a,min,(ssize_t *)0x0);
          if (isodirrec != (byte *)0x0) {
            *(long *)((long)pvVar37 + 0xa0) = *(long *)((long)pvVar37 + 0xa0) + min;
            if (min != 0) {
              local_48 = (heap_queue *)((long)pvVar37 + 0x70);
              local_80 = (file_info *)0x0;
              sVar21 = min;
              local_40 = pvVar37;
              do {
                lVar24 = *(long *)((long)local_40 + 0xa8);
                pbVar27 = isodirrec + lVar24;
                local_38 = sVar21;
                if ((((ulong)*isodirrec != 0) && (0 < lVar24)) &&
                   ((long)(ulong)*isodirrec <= lVar24)) {
                  do {
                    if ((isodirrec[0x20] != 1) || (1 < isodirrec[0x21])) {
                      pfVar19 = parse_file_info(a,pfVar17,isodirrec,(long)pbVar27 - (long)isodirrec)
                      ;
                      if (pfVar19 == (file_info *)0x0) {
LAB_003faec9:
                        __archive_read_consume(a,min);
                        goto LAB_003faf1a;
                      }
                      if ((pfVar19->cl_offset == 0) &&
                         ((iVar38 = pfVar19->multi_extent, iVar38 != 0 ||
                          (local_80 != (file_info *)0x0)))) {
                        if (local_80 == (file_info *)0x0) {
                          (pfVar19->contents).first = (content *)0x0;
                          (pfVar19->contents).last = &(pfVar19->contents).first;
                          local_80 = pfVar19;
                        }
                        pcVar20 = (content *)malloc(0x18);
                        if (pcVar20 == (content *)0x0) {
                          archive_set_error(&a->archive,0xc,"No memory for multi extent");
                          goto LAB_003faec9;
                        }
                        uVar18 = pfVar19->offset;
                        pcVar20->offset = uVar18;
                        uVar12 = pfVar19->size;
                        pcVar20->size = uVar12;
                        pcVar20->next = (content *)0x0;
                        *(local_80->contents).last = pcVar20;
                        (local_80->contents).last = &pcVar20->next;
                        if (local_80 != pfVar19) {
                          local_80->size = local_80->size + uVar12;
                          if (iVar38 == 0) {
                            local_80 = (file_info *)0x0;
                          }
                          goto LAB_003fa98c;
                        }
                      }
                      else {
                        uVar18 = pfVar19->offset;
                      }
                      iVar38 = heap_add_entry(a,local_48,pfVar19,uVar18);
                      if (iVar38 != 0) goto LAB_003faf1a;
                    }
LAB_003fa98c:
                    pbVar4 = isodirrec + *isodirrec;
                  } while ((((ulong)*pbVar4 != 0) &&
                           (isodirrec = isodirrec + *isodirrec, isodirrec < pbVar27)) &&
                          (isodirrec + *pbVar4 <= pbVar27));
                }
                sVar21 = local_38 - lVar24;
                isodirrec = pbVar27;
                pvVar37 = local_40;
              } while (sVar21 != 0);
            }
            __archive_read_consume(a,min);
            if (*(int *)((long)pvVar37 + 0x40) != 0) {
              uVar25 = *(ulong *)((long)pvVar37 + 0xa8);
              lVar24 = *(long *)((long)pvVar37 + 0xa0);
              do {
                if (**(long **)((long)pvVar37 + 0x38) != lVar24) break;
                pvVar22 = __archive_read_ahead(a,uVar25,(ssize_t *)0x0);
                if (pvVar22 == (void *)0x0) goto LAB_003faf04;
                plVar23 = *(long **)((long)pvVar37 + 0x38);
                do {
                  pfVar19 = (file_info *)plVar23[1];
                  uVar7 = pfVar19->ce_offset;
                  uVar8 = pfVar19->ce_size;
                  if (uVar25 < uVar8 + uVar7) {
                    fmt = "Malformed CE information";
                    iVar38 = 0x54;
                    goto LAB_003faf13;
                  }
                  if (0 < *(int *)((long)pvVar37 + 0x40)) {
                    uVar29 = *(int *)((long)pvVar37 + 0x40) - 1;
                    *(uint *)((long)pvVar37 + 0x40) = uVar29;
                    lVar24 = (plVar23 + (ulong)uVar29 * 2)[1];
                    *plVar23 = plVar23[(ulong)uVar29 * 2];
                    plVar23[1] = lVar24;
                    iVar38 = *(int *)((long)pvVar37 + 0x40);
                    if (1 < iVar38) {
                      uVar11 = **(ulong **)((long)pvVar37 + 0x38);
                      iVar34 = 0;
                      iVar33 = 1;
                      iVar35 = 0;
                      do {
                        lVar24 = *(long *)((long)pvVar37 + 0x38);
                        uVar36 = *(ulong *)(lVar24 + (long)iVar33 * 0x10);
                        iVar34 = iVar34 + 2;
                        iVar32 = iVar33;
                        if ((iVar34 < iVar38) &&
                           (uVar13 = *(ulong *)(lVar24 + (long)iVar34 * 0x10), uVar13 < uVar36)) {
                          uVar36 = uVar13;
                          iVar32 = iVar34;
                        }
                        if (uVar11 <= uVar36) break;
                        puVar5 = (undefined8 *)(lVar24 + (long)iVar35 * 0x10);
                        local_68 = (file_info *)*puVar5;
                        ppfStack_60 = (file_info **)puVar5[1];
                        iVar33 = iVar32 * 2 + 1;
                        puVar5 = (undefined8 *)(lVar24 + (long)iVar32 * 0x10);
                        uVar16 = puVar5[1];
                        puVar6 = (undefined8 *)(lVar24 + (long)iVar35 * 0x10);
                        *puVar6 = *puVar5;
                        puVar6[1] = uVar16;
                        puVar5 = (undefined8 *)
                                 (*(long *)((long)pvVar37 + 0x38) + (long)iVar32 * 0x10);
                        *puVar5 = local_68;
                        puVar5[1] = ppfStack_60;
                        iVar34 = iVar32 * 2;
                        iVar38 = *(int *)((long)pvVar37 + 0x40);
                        iVar35 = iVar32;
                      } while (iVar33 < iVar38);
                    }
                  }
                  p = (uchar *)((ulong)uVar7 + (long)pvVar22);
                  iVar38 = parse_rockridge(a,pfVar19,p,p + uVar8);
                  if (iVar38 != 0) goto LAB_003faf1a;
                } while ((*(int *)((long)pvVar37 + 0x40) != 0) &&
                        (plVar23 = *(long **)((long)pvVar37 + 0x38),
                        *plVar23 == *(long *)((long)pvVar37 + 0xa0)));
                __archive_read_consume(a,uVar25);
                lVar24 = *(long *)((long)pvVar37 + 0xa0) + uVar25;
                *(long *)((long)pvVar37 + 0xa0) = lVar24;
              } while (*(int *)((long)pvVar37 + 0x40) != 0);
            }
            goto LAB_003facdb;
          }
LAB_003faf04:
          fmt = "Failed to read full block when scanning ISO9660 directory list";
          iVar38 = -1;
LAB_003faf13:
          archive_set_error(&a->archive,iVar38,fmt);
          goto LAB_003faf1a;
        }
        uVar25 = __archive_read_consume(a,uVar11 - uVar25);
        if (-1 < (long)uVar25) {
          *(uint64_t *)((long)pvVar37 + 0xa0) = pfVar17->offset;
          uVar18 = pfVar17->size;
          goto LAB_003fa885;
        }
        if ((int)uVar25 != 0) goto LAB_003fa744;
LAB_003facdb:
        paVar28 = local_58;
        if (pfVar17->rr_moved == '\0') {
          if (pfVar17->re == '\0') {
            pfVar19 = pfVar17;
            if (pfVar17->re_descendant != '\0') {
              do {
                pfVar19 = pfVar19->parent;
                if (pfVar19 == (file_info *)0x0) goto LAB_003fafbb;
              } while (pfVar19->re == '\0');
              pfVar17->re_next = (file_info *)0x0;
              *(pfVar19->rede_files).last = pfVar17;
              (pfVar19->rede_files).last = &pfVar17->re_next;
              goto LAB_003fad68;
            }
            goto LAB_003fafbb;
          }
          pfVar17->re_next = (file_info *)0x0;
          *(iso9660->re_files).last = pfVar17;
          (iso9660->re_files).last = &pfVar17->re_next;
        }
        else if (pfVar17->rr_moved_has_re_only == '\0') goto LAB_003fafbb;
      }
      else {
        pfVar19 = (file_info *)0x0;
        while( true ) {
          pfVar9 = paVar30->first;
          if ((pfVar9 != (file_info *)0x0) &&
             (pfVar10 = pfVar9->re_next, paVar30->first = pfVar10, pfVar10 == (file_info *)0x0)) {
            (iso9660->re_files).last = &paVar30->first;
          }
          if (pfVar9 == pfVar19) goto LAB_003fafbb;
          if (pfVar9->offset == uVar18) break;
          if (pfVar19 == (file_info *)0x0) {
            pfVar19 = pfVar9;
          }
          pfVar9->re_next = (file_info *)0x0;
          *(iso9660->re_files).last = pfVar9;
          (iso9660->re_files).last = &pfVar9->re_next;
        }
        piVar1 = &pfVar9->parent->subdirs;
        *piVar1 = *piVar1 + -1;
        pfVar17 = pfVar17->parent;
        pfVar9->parent = pfVar17;
        pfVar9->re = '\0';
        if (pfVar17->re_descendant == '\0') goto LAB_003faf6a;
        pfVar9->re_descendant = '\x01';
        pfVar17 = pfVar9;
        do {
          pfVar17 = pfVar17->parent;
          if (pfVar17 == (file_info *)0x0) goto LAB_003fae9b;
        } while (pfVar17->re == '\0');
        pfVar9->re_next = (file_info *)0x0;
        *(pfVar17->rede_files).last = pfVar9;
        (pfVar17->rede_files).last = &pfVar9->re_next;
        pfVar17 = (pfVar9->rede_files).first;
        local_50 = paVar30;
        if (pfVar17 != (file_info *)0x0) {
          paVar2 = &pfVar9->rede_files;
          do {
            pfVar19 = pfVar17->re_next;
            paVar2->first = pfVar19;
            if (pfVar19 == (file_info *)0x0) {
              (pfVar9->rede_files).last = &paVar2->first;
            }
            pfVar19 = pfVar17;
            do {
              pfVar19 = pfVar19->parent;
              if (pfVar19 == (file_info *)0x0) goto LAB_003fae9b;
            } while (pfVar19->re == '\0');
            pfVar17->re_next = (file_info *)0x0;
            *(pfVar19->rede_files).last = pfVar17;
            (pfVar19->rede_files).last = &pfVar17->re_next;
            pfVar17 = paVar2->first;
          } while (pfVar17 != (file_info *)0x0);
        }
      }
LAB_003fad68:
      pfVar17 = heap_get_entry(heap);
      *pfile = pfVar17;
      paVar30 = local_50;
      if (pfVar17 == (file_info *)0x0) goto LAB_003fad86;
      goto LAB_003fa780;
    }
LAB_003fad86:
    pfVar17 = (iso9660->re_files).first;
    if (pfVar17 != (file_info *)0x0) {
      pfVar19 = iso9660->rr_moved;
      if ((pfVar19 != (file_info *)0x0) && (pfVar19->rr_moved_has_re_only != '\0')) {
        pfVar19->next = (file_info *)0x0;
        *(iso9660->cache_files).last = pfVar19;
        (iso9660->cache_files).last = &pfVar19->next;
        pfVar17 = (iso9660->re_files).first;
        if (pfVar17 == (file_info *)0x0) goto LAB_003fae78;
      }
      paVar30 = &iso9660->re_files;
      do {
        pfVar19 = pfVar17->re_next;
        paVar30->first = pfVar19;
        if (pfVar19 == (file_info *)0x0) {
          (iso9660->re_files).last = &paVar30->first;
        }
        pfVar9 = (pfVar17->rede_files).first;
        if (pfVar9 != (file_info *)0x0) {
          paVar2 = &pfVar17->rede_files;
          pfVar19 = pfVar9->re_next;
          paVar2->first = pfVar19;
          if (pfVar19 == (file_info *)0x0) {
            (pfVar17->rede_files).last = &paVar2->first;
          }
          ppfVar14 = (iso9660->cache_files).last;
          ppfVar31 = &pfVar9->next;
          pfVar9->next = (file_info *)0x0;
          *ppfVar14 = pfVar9;
          (iso9660->cache_files).last = ppfVar31;
          pfVar19 = (pfVar17->rede_files).first;
          while (pfVar19 != (file_info *)0x0) {
            pfVar9 = pfVar19->re_next;
            paVar2->first = pfVar9;
            if (pfVar9 == (file_info *)0x0) {
              (pfVar17->rede_files).last = &paVar2->first;
            }
            pfVar19->next = (file_info *)0x0;
            *ppfVar31 = pfVar19;
            ppfVar31 = &pfVar19->next;
            (iso9660->cache_files).last = ppfVar31;
            pfVar19 = paVar2->first;
          }
          pfVar19 = paVar30->first;
        }
        pfVar17 = pfVar19;
      } while (pfVar17 != (file_info *)0x0);
    }
LAB_003fae78:
  } while (paVar28->first != (file_info *)0x0);
  uVar25 = 1;
LAB_003fa744:
  return (int)uVar25;
LAB_003faf6a:
  *pfile = pfVar9;
  pfVar19 = (pfVar9->rede_files).first;
  pfVar17 = pfVar9;
  if (pfVar19 != (file_info *)0x0) {
    paVar2 = &pfVar9->rede_files;
    do {
      pfVar10 = pfVar19->re_next;
      paVar2->first = pfVar10;
      if (pfVar10 == (file_info *)0x0) {
        (pfVar9->rede_files).last = &paVar2->first;
      }
      pfVar19->next = (file_info *)0x0;
      *(iso9660->cache_files).last = pfVar19;
      (iso9660->cache_files).last = &pfVar19->next;
      pfVar19 = paVar2->first;
    } while (pfVar19 != (file_info *)0x0);
  }
LAB_003fafbb:
  uVar25 = 0;
  if (((pfVar17->mode & 0xf000) == 0x8000) && (lVar24 = pfVar17->number, lVar24 != -1)) {
    iVar38 = 0;
    (iso9660->cache_files).first = (file_info *)0x0;
    (iso9660->cache_files).last = &paVar28->first;
    local_68 = (file_info *)0x0;
    ppfStack_60 = &local_68;
    if (0 < (iso9660->pending_files).used) {
      pppfVar3 = &(iso9660->cache_files).last;
      do {
        lVar15 = (*heap->files)->number;
        if ((lVar15 != -1) && (lVar15 != lVar24)) break;
        bVar39 = pfVar17->number != -1;
        pppfVar26 = pppfVar3;
        if (!bVar39) {
          pppfVar26 = &ppfStack_60;
        }
        iVar38 = iVar38 + (uint)bVar39;
        pfVar17->next = (file_info *)0x0;
        **pppfVar26 = pfVar17;
        *pppfVar26 = &pfVar17->next;
        pfVar17 = heap_get_entry(heap);
      } while (0 < (iso9660->pending_files).used);
      if (iVar38 != 0) {
        bVar39 = pfVar17->number != -1;
        pppfVar26 = &ppfStack_60;
        if (bVar39) {
          pppfVar26 = pppfVar3;
        }
        iVar38 = iVar38 + (uint)bVar39;
        pfVar17->next = (file_info *)0x0;
        **pppfVar26 = pfVar17;
        *pppfVar26 = &pfVar17->next;
        if (1 < iVar38) {
          for (pfVar17 = paVar28->first; pfVar17 != (file_info *)0x0; pfVar17 = pfVar17->next) {
            pfVar17->nlinks = iVar38;
          }
        }
        if (local_68 != (file_info *)0x0) {
          **pppfVar3 = local_68;
          *pppfVar3 = ppfStack_60;
        }
        pfVar17 = paVar28->first;
        if ((pfVar17 != (file_info *)0x0) &&
           (pfVar19 = pfVar17->next, paVar28->first = pfVar19, pfVar19 == (file_info *)0x0)) {
          *pppfVar3 = &paVar28->first;
        }
        uVar25 = (ulong)(pfVar17 == (file_info *)0x0);
        *pfile = pfVar17;
        goto LAB_003fa744;
      }
    }
    *pfile = pfVar17;
    uVar25 = (ulong)(pfVar17 == (file_info *)0x0);
  }
  goto LAB_003fa744;
LAB_003fae9b:
  archive_set_error(&a->archive,-1,
                    "Failed to connect \'CL\' pointer to \'RE\' rr_moved pointer of Rockridge extensions: current position = %jd, CL offset = %jd"
                    ,iso9660->current_position);
LAB_003faf1a:
  uVar25 = 0xffffffe2;
  goto LAB_003fa744;
}

Assistant:

static int
next_cache_entry(struct archive_read *a, struct iso9660 *iso9660,
    struct file_info **pfile)
{
	struct file_info *file;
	struct {
		struct file_info	*first;
		struct file_info	**last;
	}	empty_files;
	int64_t number;
	int count;

	file = cache_get_entry(iso9660);
	if (file != NULL) {
		*pfile = file;
		return (ARCHIVE_OK);
	}

	for (;;) {
		struct file_info *re, *d;

		*pfile = file = next_entry(iso9660);
		if (file == NULL) {
			/*
			 * If directory entries all which are descendant of
			 * rr_moved are still remaining, expose their.
			 */
			if (iso9660->re_files.first != NULL && 
			    iso9660->rr_moved != NULL &&
			    iso9660->rr_moved->rr_moved_has_re_only)
				/* Expose "rr_moved" entry. */
				cache_add_entry(iso9660, iso9660->rr_moved);
			while ((re = re_get_entry(iso9660)) != NULL) {
				/* Expose its descendant dirs. */
				while ((d = rede_get_entry(re)) != NULL)
					cache_add_entry(iso9660, d);
			}
			if (iso9660->cache_files.first != NULL)
				return (next_cache_entry(a, iso9660, pfile));
			return (ARCHIVE_EOF);
		}

		if (file->cl_offset) {
			struct file_info *first_re = NULL;
			int nexted_re = 0;

			/*
			 * Find "RE" dir for the current file, which
			 * has "CL" flag.
			 */
			while ((re = re_get_entry(iso9660))
			    != first_re) {
				if (first_re == NULL)
					first_re = re;
				if (re->offset == file->cl_offset) {
					re->parent->subdirs--;
					re->parent = file->parent;
					re->re = 0;
					if (re->parent->re_descendant) {
						nexted_re = 1;
						re->re_descendant = 1;
						if (rede_add_entry(re) < 0)
							goto fatal_rr;
						/* Move a list of descendants
						 * to a new ancestor. */
						while ((d = rede_get_entry(
						    re)) != NULL)
							if (rede_add_entry(d)
							    < 0)
								goto fatal_rr;
						break;
					}
					/* Replace the current file
					 * with "RE" dir */
					*pfile = file = re;
					/* Expose its descendant */
					while ((d = rede_get_entry(
					    file)) != NULL)
						cache_add_entry(
						    iso9660, d);
					break;
				} else
					re_add_entry(iso9660, re);
			}
			if (nexted_re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				continue;
			}
		} else if ((file->mode & AE_IFMT) == AE_IFDIR) {
			int r;

			/* Read file entries in this dir. */
			r = read_children(a, file);
			if (r != ARCHIVE_OK)
				return (r);

			/*
			 * Handle a special dir of Rockridge extensions,
			 * "rr_moved".
			 */
			if (file->rr_moved) {
				/*
				 * If this has only the subdirectories which
				 * have "RE" flags, do not expose at this time.
				 */
				if (file->rr_moved_has_re_only)
					continue;
				/* Otherwise expose "rr_moved" entry. */
			} else if (file->re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				re_add_entry(iso9660, file);
				continue;
			} else if (file->re_descendant) {
				/*
				 * If the top level "RE" entry of this entry
				 * is not exposed, we, accordingly, should not
				 * expose this entry at this time because
				 * we cannot make its proper full-path name.
				 */
				if (rede_add_entry(file) == 0)
					continue;
				/* Otherwise we can expose this entry because
				 * it seems its top level "RE" has already been
				 * exposed. */
			}
		}
		break;
	}

	if ((file->mode & AE_IFMT) != AE_IFREG || file->number == -1)
		return (ARCHIVE_OK);

	count = 0;
	number = file->number;
	iso9660->cache_files.first = NULL;
	iso9660->cache_files.last = &(iso9660->cache_files.first);
	empty_files.first = NULL;
	empty_files.last = &empty_files.first;
	/* Collect files which has the same file serial number.
	 * Peek pending_files so that file which number is different
	 * is not put back. */
	while (iso9660->pending_files.used > 0 &&
	    (iso9660->pending_files.files[0]->number == -1 ||
	     iso9660->pending_files.files[0]->number == number)) {
		if (file->number == -1) {
			/* This file has the same offset
			 * but it's wrong offset which empty files
			 * and symlink files have.
			 * NOTE: This wrong offset was recorded by
			 * old mkisofs utility. If ISO images is
			 * created by latest mkisofs, this does not
			 * happen.
			 */
			file->next = NULL;
			*empty_files.last = file;
			empty_files.last = &(file->next);
		} else {
			count++;
			cache_add_entry(iso9660, file);
		}
		file = next_entry(iso9660);
	}

	if (count == 0) {
		*pfile = file;
		return ((file == NULL)?ARCHIVE_EOF:ARCHIVE_OK);
	}
	if (file->number == -1) {
		file->next = NULL;
		*empty_files.last = file;
		empty_files.last = &(file->next);
	} else {
		count++;
		cache_add_entry(iso9660, file);
	}

	if (count > 1) {
		/* The count is the same as number of hardlink,
		 * so much so that each nlinks of files in cache_file
		 * is overwritten by value of the count.
		 */
		for (file = iso9660->cache_files.first;
		    file != NULL; file = file->next)
			file->nlinks = count;
	}
	/* If there are empty files, that files are added
	 * to the tail of the cache_files. */
	if (empty_files.first != NULL) {
		*iso9660->cache_files.last = empty_files.first;
		iso9660->cache_files.last = empty_files.last;
	}
	*pfile = cache_get_entry(iso9660);
	return ((*pfile == NULL)?ARCHIVE_EOF:ARCHIVE_OK);

fatal_rr:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Failed to connect 'CL' pointer to 'RE' rr_moved pointer of "
	    "Rockridge extensions: current position = %jd, CL offset = %jd",
	    (intmax_t)iso9660->current_position, (intmax_t)file->cl_offset);
	return (ARCHIVE_FATAL);
}